

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::ParameterizedTestFactory<UnsignedLongLong_Unsigned_Test>::CreateTest
          (ParameterizedTestFactory<UnsignedLongLong_Unsigned_Test> *this)

{
  Test *this_00;
  
  WithParamInterface<unsigned_long_long>::parameter_ = &this->parameter_;
  this_00 = (Test *)operator_new(0x18);
  UnsignedLongLong_Unsigned_Test::UnsignedLongLong_Unsigned_Test
            ((UnsignedLongLong_Unsigned_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }